

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

void do_with_oh_void(qpdf_data qpdf,qpdf_oh oh,function<void_(QPDFObjectHandle_&)> *fn)

{
  size_t *psVar1;
  undefined1 this [8];
  uint uVar2;
  _Node *p_Var3;
  char *cstr;
  Pipeline *this_00;
  bool ret;
  undefined1 local_142;
  undefined1 local_141;
  undefined1 local_140 [8];
  undefined1 local_138 [24];
  _Invoker_type p_Stack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Any_data local_108;
  code *local_f8;
  code *pcStack_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  undefined8 uStack_b0;
  int local_a4;
  _Any_data local_a0;
  code *local_90;
  undefined8 uStack_88;
  qpdf_oh local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_e8._M_unused._M_object = &local_142;
  local_142 = 0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_manager;
  std::function<void_(QPDFObjectHandle_&)>::function
            ((function<void_(QPDFObjectHandle_&)> *)&local_c8,fn);
  local_f8 = (code *)0x0;
  pcStack_f0 = (code *)0x0;
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_108._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_108._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_108._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_108._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_108._M_unused._0_8_ + 0x18) = uStack_b0;
  if (local_b8 != (code *)0x0) {
    *(void **)local_108._M_unused._0_8_ = local_c8._M_unused._M_object;
    *(undefined8 *)((long)local_108._M_unused._0_8_ + 8) = local_c8._8_8_;
    *(code **)((long)local_108._M_unused._0_8_ + 0x10) = local_b8;
    local_b8 = (code *)0x0;
    uStack_b0 = 0;
  }
  pcStack_f0 = std::
               _Function_handler<bool_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:938:55)>
               ::_M_invoke;
  local_f8 = std::
             _Function_handler<bool_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:938:55)>
             ::_M_manager;
  std::function<bool_()>::function((function<bool_()> *)&local_38,(function<bool_()> *)&local_e8);
  std::function<bool_(QPDFObjectHandle_&)>::function
            ((function<bool_(QPDFObjectHandle_&)> *)&local_a0,
             (function<bool_(QPDFObjectHandle_&)> *)&local_108);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_80 = oh;
  local_78._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_78._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x18) = uStack_88;
  if (local_90 != (code *)0x0) {
    *(void **)local_78._M_unused._0_8_ = local_a0._M_unused._M_object;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_a0._8_8_;
    *(code **)((long)local_78._M_unused._0_8_ + 0x10) = local_90;
    local_90 = (code *)0x0;
    uStack_88 = 0;
  }
  *(qpdf_oh *)((long)local_78._M_unused._0_8_ + 0x20) = oh;
  pcStack_60 = std::
               _Function_handler<bool_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  local_140 = (undefined1  [8])&local_141;
  std::function<bool_(_qpdf_data_*)>::function
            ((function<bool_(_qpdf_data_*)> *)local_138,(function<bool_(_qpdf_data_*)> *)&local_78);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x28);
  *(undefined1 (*) [8])local_58._M_unused._0_8_ = local_140;
  *(long *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(long *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
  *(long *)((long)local_58._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_58._M_unused._0_8_ + 0x20) = p_Stack_120;
  if ((code *)local_138._16_8_ != (code *)0x0) {
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_138._0_8_;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = local_138._8_8_;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x18) = local_138._16_8_;
    local_138._16_8_ = (code *)0x0;
    p_Stack_120 = (_Invoker_type)0x0;
  }
  pcStack_40 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
             ::_M_manager;
  uVar2 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((code *)local_138._16_8_ != (code *)0x0) {
    (*(code *)local_138._16_8_)
              ((function<bool_(_qpdf_data_*)> *)local_138,(function<bool_(_qpdf_data_*)> *)local_138
               ,3);
  }
  if (1 < uVar2) {
    if (qpdf->silence_errors == false) {
      if (qpdf->oh_error_occurred == false) {
        local_118._M_allocated_capacity._0_4_ = 1;
        QPDF::getFilename_abi_cxx11_
                  ((string *)local_140,
                   (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_a4 = 0;
        p_Var3 = std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
                 _M_create_node<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                           ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf->warnings,
                            (qpdf_error_code_e *)&local_118._M_allocated_capacity,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_140,(char (*) [1])0x27ace6,&local_a4,
                            (char (*) [129])
                            "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                           );
        std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
        psVar1 = &(qpdf->warnings).super__List_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_140 != (undefined1  [8])(local_138 + 8)) {
          operator_delete((void *)local_140,local_138._8_8_ + 1);
        }
        qpdf->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)local_140,SUB41(local_118._M_allocated_capacity._0_4_,0));
      this = local_140;
      cstr = (char *)(**(code **)(*(long *)(qpdf->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this_00 = Pipeline::operator<<((Pipeline *)this,cstr);
      Pipeline::operator<<(this_00,"\n");
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
      }
    }
    if (local_28 == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    (*local_20)(&local_38);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  return;
}

Assistant:

static void
do_with_oh_void(qpdf_data qpdf, qpdf_oh oh, std::function<void(QPDFObjectHandle&)> fn)
{
    do_with_oh<bool>(qpdf, oh, return_T<bool>(false), [fn](QPDFObjectHandle& o) {
        fn(o);
        return true; // unused
    });
}